

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCooledBeamType::~IfcCooledBeamType(IfcCooledBeamType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcEnergyConversionDeviceType).
                              super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject + -0x18)
  ;
  this_00 = (IfcTypeProduct *)
            ((long)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType
                    .super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1d0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1d0) = 0x830b90;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x830cf8;
  *(undefined8 *)((long)pvVar1 + -0x148) = 0x830bb8;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x830be0;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x830c08;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x830c30;
  *(undefined8 *)((long)pvVar1 + -0x50) = 0x830c58;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x830c80;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x830ca8;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x830cd0;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x831320;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x80 = 0x8313e8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x831348;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x831370;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x831398;
  *(undefined8 *)&this_00->field_0x148 = 0x8313c0;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__00830d30);
  return;
}

Assistant:

IfcCooledBeamType() : Object("IfcCooledBeamType") {}